

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

void cJSON_AddItemToArray(cJSON *array,cJSON *item)

{
  cJSON *pcVar1;
  cJSON *pcVar2;
  
  if (item != (cJSON *)0x0) {
    pcVar1 = array->child;
    if (array->child == (cJSON *)0x0) {
      array->child = item;
      return;
    }
    do {
      pcVar2 = pcVar1;
      pcVar1 = pcVar2->next;
    } while (pcVar2->next != (cJSON *)0x0);
    pcVar2->next = item;
    item->prev = pcVar2;
  }
  return;
}

Assistant:

void
cJSON_AddItemToArray(cJSON *array, cJSON *item)
{
    cJSON *c = array->child;
    if (!item)
        return;
    if (!c) {
        array->child = item;
    } else {
        while (c && c->next)
            c = c->next;
        suffix_object(c, item);
    }
}